

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::UniformCase::assignUniforms
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL,Random *rnd)

{
  CallLogWrapper *this_00;
  pointer pBVar1;
  ulong uVar2;
  pointer pVVar3;
  string *psVar4;
  DataType scalarType;
  GLint location;
  uint uVar5;
  int iVar6;
  DataType DVar7;
  deUint32 dVar8;
  int iVar9;
  int iVar10;
  GLenum GVar11;
  pointer pBVar12;
  long *plVar13;
  undefined8 *puVar14;
  char *pcVar15;
  size_t sVar16;
  ulong *puVar17;
  long *plVar18;
  ulong uVar19;
  VarValue *value;
  VarValue *value_00;
  pointer pBVar20;
  GLsizei GVar21;
  uint uVar22;
  int iVar23;
  pointer pBVar24;
  VarValue *pVVar25;
  undefined8 uVar26;
  char cVar27;
  int iVar28;
  DataType *pDVar29;
  undefined8 *puVar30;
  undefined4 *puVar31;
  _Alloc_hider _Var32;
  uint uVar33;
  long lVar34;
  uint uVar35;
  byte bVar36;
  float fVar37;
  string curName;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
  valuesToAssign;
  VarValue apiValue;
  string queryName;
  VarValue result_2;
  GLboolean local_364;
  string local_350;
  UniformCase *local_330;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
  local_308;
  TestLog *local_2e8;
  deRandom *local_2e0;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  int local_2cc;
  undefined8 local_2c8;
  undefined8 local_2c0;
  long local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  VarValue *local_238;
  long *local_230 [2];
  long local_220 [2];
  ulong local_210;
  long local_208;
  string *local_200;
  undefined1 local_1f8 [72];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar36 = 0;
  local_2d4 = *(uint *)&(this->super_CallLogWrapper).field_0x14;
  DVar7 = TYPE_UINT;
  if (-1 < (char)local_2d4) {
    DVar7 = TYPE_FLOAT;
  }
  scalarType = TYPE_INT;
  if ((local_2d4 & 0x40) == 0) {
    scalarType = DVar7;
  }
  pBVar12 = (basicUniforms->
            super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(basicUniforms->
                              super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12) >> 3) *
          0x286bca1b) {
    local_2e8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_2d4 = local_2d4 & 4;
    uVar22 = local_2d4 >> 2;
    this_00 = &this->super_CallLogWrapper;
    local_208 = 0;
    local_330 = this;
    local_2e0 = &rnd->m_rnd;
    do {
      pBVar1 = pBVar12 + local_208;
      iVar6 = pBVar12[local_208].elemNdx;
      if ((((local_330->super_CallLogWrapper).field_0x15 & 1) == 0) || (iVar6 != 0)) {
        local_230[0] = local_220;
        _Var32._M_p = (pBVar1->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_230,_Var32._M_p,_Var32._M_p + (pBVar1->name)._M_string_length);
        if (-1 < iVar6) goto LAB_0154ba43;
        uVar35 = 1;
LAB_0154bb32:
        location = glu::CallLogWrapper::glGetUniformLocation
                             (this_00,programGL,(GLchar *)local_230[0]);
        uVar19 = (ulong)pBVar1->type;
        uVar5 = glu::getDataTypeScalarSize(pBVar1->type);
        if (((local_330->super_CallLogWrapper).field_0x14 & 2) == 0) {
          uVar19 = 0;
        }
        else {
          uVar19 = CONCAT71((int7)(uVar19 >> 8),
                            uVar35 == 1 &&
                            (pBVar1->type - TYPE_INT < 0xfffffff7 &&
                            pBVar1->type - TYPE_DOUBLE < 0xfffffff7));
        }
        local_308.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_308.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_308.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (0 < (int)uVar35) {
          local_2d8 = (uint)uVar19;
          local_238 = &pBVar1->finalValue;
          local_200 = &pBVar1->rootName;
          uVar33 = 0;
          local_2d0 = uVar35;
          local_2cc = iVar6;
          local_210 = (ulong)uVar5;
          do {
            psVar4 = local_200;
            if (local_2cc < 0) {
              local_328 = &local_318;
              _Var32._M_p = (pBVar1->name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_328,_Var32._M_p,
                         _Var32._M_p + (pBVar1->name)._M_string_length);
              pVVar25 = local_238;
LAB_0154bf14:
              pDVar29 = (DataType *)&local_2c8;
              for (lVar34 = 0x11; lVar34 != 0; lVar34 = lVar34 + -1) {
                *pDVar29 = pVVar25->type;
                pVVar25 = (VarValue *)((long)pVVar25 + (ulong)bVar36 * -8 + 4);
                pDVar29 = pDVar29 + (ulong)bVar36 * -2 + 1;
              }
              if ((DataType)local_2c8 - TYPE_BOOL < 4) {
                uVar35 = glu::getDataTypeScalarSize((DataType)local_2c8);
                DVar7 = scalarType;
                if (uVar35 != 1) {
                  DVar7 = glu::getDataTypeVector(scalarType,uVar35);
                }
                local_280 = (ulong *)CONCAT44(local_280._4_4_,DVar7);
                if (scalarType == TYPE_UINT) {
                  if (0 < (int)uVar35) {
                    uVar19 = 0;
                    do {
                      iVar6 = 0;
                      if (*(char *)((long)&local_2c8 + uVar19 + 4) == '\x01') {
                        dVar8 = deRandom_getUint32(local_2e0);
                        iVar6 = dVar8 % 10 + 1;
                      }
                      *(int *)((long)&local_280 + uVar19 * 4 + 4) = iVar6;
                      uVar19 = uVar19 + 1;
                    } while (uVar35 != uVar19);
                  }
                }
                else if (scalarType == TYPE_INT) {
                  if (0 < (int)uVar35) {
                    uVar19 = 0;
                    do {
                      if (*(char *)((long)&local_2c8 + uVar19 + 4) == '\x01') {
                        dVar8 = deRandom_getUint32(local_2e0);
                        *(uint *)((long)&local_280 + uVar19 * 4 + 4) =
                             (dVar8 % 0x15 - 10) + (uint)(dVar8 % 0x15 == 10);
                      }
                      else {
                        *(undefined4 *)((long)&local_280 + uVar19 * 4 + 4) = 0;
                      }
                      uVar19 = uVar19 + 1;
                    } while (uVar35 != uVar19);
                  }
                }
                else if ((scalarType == TYPE_FLOAT) && (0 < (int)uVar35)) {
                  uVar19 = 0;
                  do {
                    if (*(char *)((long)&local_2c8 + uVar19 + 4) == '\x01') {
                      fVar37 = deRandom_getFloat(local_2e0);
                      fVar37 = fVar37 * 20.0 + -10.0;
                      *(float *)((long)&local_280 + uVar19 * 4 + 4) = fVar37;
                      if ((fVar37 == 0.0) && (!NAN(fVar37))) {
                        *(undefined4 *)((long)&local_280 + uVar19 * 4 + 4) = 0x3f800000;
                      }
                    }
                    else {
                      *(undefined4 *)((long)&local_280 + uVar19 * 4 + 4) = 0;
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar35 != uVar19);
                }
              }
              else if ((DataType)local_2c8 - TYPE_SAMPLER_1D < 0x1e) {
                local_280 = (ulong *)CONCAT44(local_2c8._4_4_,0x1b);
              }
              else {
                puVar14 = &local_2c8;
                puVar30 = &local_280;
                for (lVar34 = 0x11; lVar34 != 0; lVar34 = lVar34 + -1) {
                  *(undefined4 *)puVar30 = *(undefined4 *)puVar14;
                  puVar14 = (undefined8 *)((long)puVar14 + (ulong)bVar36 * -8 + 4);
                  puVar30 = (undefined8 *)((long)puVar30 + (ulong)bVar36 * -8 + 4);
                }
              }
              DVar7 = (DataType)local_280;
              if ((DataType)local_280 - TYPE_INT < 0xfffffff7 &&
                  (DataType)local_280 - TYPE_DOUBLE < 0xfffffff7 || local_2d4 == 0) {
                puVar14 = &local_280;
                puVar31 = (undefined4 *)local_1b0;
                for (lVar34 = 0x11; lVar34 != 0; lVar34 = lVar34 + -1) {
                  *puVar31 = *(undefined4 *)puVar14;
                  puVar14 = (undefined8 *)((long)puVar14 + (ulong)bVar36 * -8 + 4);
                  puVar31 = puVar31 + (ulong)bVar36 * -2 + 1;
                }
              }
              else {
                iVar6 = glu::getDataTypeMatrixNumRows((DataType)local_280);
                uVar35 = glu::getDataTypeMatrixNumColumns(DVar7);
                iVar9 = glu::getDataTypeMatrixNumRows(DVar7);
                iVar10 = glu::getDataTypeMatrixNumColumns(DVar7);
                DVar7 = glu::getDataTypeMatrix(iVar9,iVar10);
                local_1b0._0_4_ = DVar7;
                if (0 < iVar6) {
                  iVar9 = 0;
                  iVar10 = 0;
                  do {
                    uVar19 = (ulong)uVar35;
                    iVar23 = iVar10;
                    iVar28 = iVar9;
                    if (0 < (int)uVar35) {
                      do {
                        *(undefined4 *)(local_1b0 + (long)iVar28 * 4 + 4) =
                             *(undefined4 *)((long)&local_280 + (long)iVar23 * 4 + 4);
                        iVar28 = iVar28 + 1;
                        iVar23 = iVar23 + iVar6;
                        uVar19 = uVar19 - 1;
                      } while (uVar19 != 0);
                    }
                    iVar10 = iVar10 + 1;
                    iVar9 = iVar9 + uVar35;
                  } while (iVar10 != iVar6);
                }
              }
              std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
              ::push_back(&local_308,(value_type *)local_1b0);
              if (pBVar1->type - TYPE_BOOL < 4) {
                local_1b0 = (undefined1  [8])local_2e8;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"// Using type ",0xe);
                pcVar15 = glu::getDataTypeName(scalarType);
                if (pcVar15 == (char *)0x0) {
                  std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
                }
                else {
                  sVar16 = strlen(pcVar15);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pcVar15,sVar16);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," to set boolean value ",0x16);
                apiVarValueStr_abi_cxx11_((string *)local_1f8,(Functional *)&local_2c8,value_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)local_1f8._0_8_,local_1f8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," for ",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)local_328,local_320);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                uVar26 = local_1f8._16_8_;
                _Var32._M_p = (pointer)local_1f8._0_8_;
                if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
LAB_0154c3dd:
                  operator_delete(_Var32._M_p,uVar26 + 1);
                }
              }
              else {
                if (0x1d < pBVar1->type - TYPE_SAMPLER_1D) goto LAB_0154c406;
                local_1b0 = (undefined1  [8])local_2e8;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"// Texture for the sampler uniform ",0x23);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)local_328,local_320);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," will be filled with color ",0x1b);
                getSamplerFillValue((VarValue *)local_1f8,local_238);
                apiVarValueStr_abi_cxx11_(&local_350,(Functional *)local_1f8,value);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_350._M_dataplus._M_p,
                           local_350._M_string_length);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                uVar26 = local_350.field_2._M_allocated_capacity;
                _Var32._M_p = local_350._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) goto LAB_0154c3dd;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
            }
            else {
              std::__cxx11::string::rfind((char)local_200,0x5b);
              std::__cxx11::string::substr((ulong)local_1f8,(ulong)psVar4);
              plVar13 = (long *)std::__cxx11::string::append(local_1f8);
              local_280 = &local_270;
              puVar17 = (ulong *)(plVar13 + 2);
              if ((ulong *)*plVar13 == puVar17) {
                local_270 = *puVar17;
                lStack_268 = plVar13[3];
              }
              else {
                local_270 = *puVar17;
                local_280 = (ulong *)*plVar13;
              }
              local_278 = plVar13[1];
              *plVar13 = (long)puVar17;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              iVar6 = pBVar1->elemNdx;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
              std::ostream::operator<<((ostringstream *)local_1b0,iVar6 + uVar33);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
              uVar19 = 0xf;
              if (local_280 != &local_270) {
                uVar19 = local_270;
              }
              if (uVar19 < local_350._M_string_length + local_278) {
                uVar26 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  uVar26 = local_350.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar26 < local_350._M_string_length + local_278) goto LAB_0154bd75;
                puVar14 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_350,0,(char *)0x0,(ulong)local_280);
              }
              else {
LAB_0154bd75:
                puVar14 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_280,(ulong)local_350._M_dataplus._M_p);
              }
              plVar13 = puVar14 + 2;
              if ((long *)*puVar14 == plVar13) {
                local_2b8 = *plVar13;
                uStack_2b0 = puVar14[3];
                local_2c8 = &local_2b8;
              }
              else {
                local_2b8 = *plVar13;
                local_2c8 = (long *)*puVar14;
              }
              local_2c0 = puVar14[1];
              *puVar14 = plVar13;
              puVar14[1] = 0;
              *(undefined1 *)plVar13 = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_2c8);
              local_328 = &local_318;
              plVar18 = plVar13 + 2;
              if ((long *)*plVar13 == plVar18) {
                local_318 = *plVar18;
                lStack_310 = plVar13[3];
              }
              else {
                local_318 = *plVar18;
                local_328 = (long *)*plVar13;
              }
              local_320 = plVar13[1];
              *plVar13 = (long)plVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if (local_2c8 != &local_2b8) {
                operator_delete(local_2c8,local_2b8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p,
                                local_350.field_2._M_allocated_capacity + 1);
              }
              if (local_280 != &local_270) {
                operator_delete(local_280,local_270 + 1);
              }
              if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
              }
              pBVar12 = (basicUniforms->
                        super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pBVar24 = (basicUniforms->
                        super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              pBVar20 = pBVar12;
              if (pBVar12 == pBVar24) {
LAB_0154bf07:
                if (pBVar24 != pBVar12) {
                  pVVar25 = &pBVar24->finalValue;
                  goto LAB_0154bf14;
                }
              }
              else {
                do {
                  iVar6 = std::__cxx11::string::compare((char *)pBVar20);
                  pBVar12 = (basicUniforms->
                            super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                  pBVar24 = pBVar20;
                  if (iVar6 == 0) goto LAB_0154bf07;
                  pBVar20 = pBVar20 + 1;
                } while (pBVar20 != pBVar12);
              }
            }
LAB_0154c406:
            if (local_328 != &local_318) {
              operator_delete(local_328,local_318 + 1);
            }
            uVar33 = uVar33 + 1;
          } while (uVar33 != local_2d0);
          uVar5 = (uint)local_210;
          uVar19 = (ulong)local_2d8;
        }
        pVVar3 = local_308.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        DVar7 = (local_308.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_start)->type;
        cVar27 = (char)uVar19;
        if (DVar7 - TYPE_FLOAT < 4) {
          if (cVar27 != '\0') {
            switch(uVar5) {
            case 1:
              glu::CallLogWrapper::glProgramUniform1f
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x58c;
              pcVar15 = "glProgramUniform1f(programGL, location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glProgramUniform2f
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x58d;
              pcVar15 = "glProgramUniform2f(programGL, location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glProgramUniform3f
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x58e;
              pcVar15 = "glProgramUniform3f(programGL, location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glProgramUniform4f
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[3]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x58f;
              pcVar15 = "glProgramUniform4f(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_0154c482_default;
            }
            glu::checkError(dVar8,pcVar15,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,iVar6);
            goto switchD_0154c482_default;
          }
          lVar34 = ((long)local_308.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_308.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_1b0,(int)uVar5 * lVar34,
                     (allocator_type *)&local_2c8);
          uVar35 = (uint)((ulong)(local_1a8._0_8_ - (long)local_1b0) >> 2);
          if (0 < (int)uVar35) {
            uVar19 = 0;
            do {
              uVar2 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
              *(float *)((long)(qpTestLog **)local_1b0 + uVar19 * 4) =
                   pVVar3[(int)((long)uVar2 / (long)(int)uVar5)].val.floatV
                   [(long)uVar2 % (long)(int)uVar5 & 0xffffffff];
              uVar19 = uVar19 + 1;
            } while ((uVar35 & 0x7fffffff) != uVar19);
          }
          GVar21 = (GLsizei)lVar34;
          switch(uVar5) {
          case 1:
            glu::CallLogWrapper::glProgramUniform1fv
                      (this_00,programGL,location,GVar21,(GLfloat *)local_1b0);
            dVar8 = glu::CallLogWrapper::glGetError(this_00);
            iVar6 = 0x59d;
            pcVar15 = 
            "glProgramUniform1fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 2:
            glu::CallLogWrapper::glProgramUniform2fv
                      (this_00,programGL,location,GVar21,(GLfloat *)local_1b0);
            dVar8 = glu::CallLogWrapper::glGetError(this_00);
            iVar6 = 0x59e;
            pcVar15 = 
            "glProgramUniform2fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 3:
            glu::CallLogWrapper::glProgramUniform3fv
                      (this_00,programGL,location,GVar21,(GLfloat *)local_1b0);
            dVar8 = glu::CallLogWrapper::glGetError(this_00);
            iVar6 = 0x59f;
            pcVar15 = 
            "glProgramUniform3fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 4:
            glu::CallLogWrapper::glProgramUniform4fv
                      (this_00,programGL,location,GVar21,(GLfloat *)local_1b0);
            dVar8 = glu::CallLogWrapper::glGetError(this_00);
            iVar6 = 0x5a0;
            pcVar15 = 
            "glProgramUniform4fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          default:
            goto switchD_0154c65c_default;
          }
          glu::checkError(dVar8,pcVar15,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,iVar6);
switchD_0154c65c_default:
          if (local_1b0 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1b0,local_1a8._8_8_ - (long)local_1b0);
          }
        }
        else {
          if (DVar7 - TYPE_FLOAT_MAT2 < 9 || DVar7 - TYPE_DOUBLE_MAT2 < 9) {
            lVar34 = ((long)local_308.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_308.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_1b0,(int)uVar5 * lVar34,
                       (allocator_type *)&local_2c8);
            uVar35 = (uint)((ulong)(local_1a8._0_8_ - (long)local_1b0) >> 2);
            if (0 < (int)uVar35) {
              uVar19 = 0;
              do {
                uVar2 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
                *(float *)((long)(qpTestLog **)local_1b0 + uVar19 * 4) =
                     pVVar3[(int)((long)uVar2 / (long)(int)uVar5)].val.floatV
                     [(long)uVar2 % (long)(int)uVar5 & 0xffffffff];
                uVar19 = uVar19 + 1;
              } while ((uVar35 & 0x7fffffff) != uVar19);
            }
            GVar21 = (GLsizei)lVar34;
            local_364 = (GLboolean)uVar22;
            switch(pBVar1->type) {
            case TYPE_FLOAT_MAT2:
              glu::CallLogWrapper::glProgramUniformMatrix2fv
                        (this_00,programGL,location,GVar21,local_364,(GLfloat *)local_1b0);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5b1;
              pcVar15 = 
              "glProgramUniformMatrix2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT2X3:
              glu::CallLogWrapper::glProgramUniformMatrix2x3fv
                        (this_00,programGL,location,GVar21,local_364,(GLfloat *)local_1b0);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5b4;
              pcVar15 = 
              "glProgramUniformMatrix2x3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT2X4:
              glu::CallLogWrapper::glProgramUniformMatrix2x4fv
                        (this_00,programGL,location,GVar21,local_364,(GLfloat *)local_1b0);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5b5;
              pcVar15 = 
              "glProgramUniformMatrix2x4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT3X2:
              glu::CallLogWrapper::glProgramUniformMatrix3x2fv
                        (this_00,programGL,location,GVar21,local_364,(GLfloat *)local_1b0);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5b6;
              pcVar15 = 
              "glProgramUniformMatrix3x2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT3:
              glu::CallLogWrapper::glProgramUniformMatrix3fv
                        (this_00,programGL,location,GVar21,local_364,(GLfloat *)local_1b0);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5b2;
              pcVar15 = 
              "glProgramUniformMatrix3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT3X4:
              glu::CallLogWrapper::glProgramUniformMatrix3x4fv
                        (this_00,programGL,location,GVar21,local_364,(GLfloat *)local_1b0);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5b7;
              pcVar15 = 
              "glProgramUniformMatrix3x4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT4X2:
              glu::CallLogWrapper::glProgramUniformMatrix4x2fv
                        (this_00,programGL,location,GVar21,local_364,(GLfloat *)local_1b0);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5b8;
              pcVar15 = 
              "glProgramUniformMatrix4x2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT4X3:
              glu::CallLogWrapper::glProgramUniformMatrix4x3fv
                        (this_00,programGL,location,GVar21,local_364,(GLfloat *)local_1b0);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5b9;
              pcVar15 = 
              "glProgramUniformMatrix4x3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT4:
              glu::CallLogWrapper::glProgramUniformMatrix4fv
                        (this_00,programGL,location,GVar21,local_364,(GLfloat *)local_1b0);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5b3;
              pcVar15 = 
              "glProgramUniformMatrix4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            default:
              goto switchD_0154c65c_default;
            }
            glu::checkError(dVar8,pcVar15,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,iVar6);
            goto switchD_0154c65c_default;
          }
          if (DVar7 - TYPE_INT < 4) {
            if (cVar27 == '\0') {
              lVar34 = ((long)local_308.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_308.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_1b0,(int)uVar5 * lVar34,
                         (allocator_type *)&local_2c8);
              uVar35 = (uint)((ulong)(local_1a8._0_8_ - (long)local_1b0) >> 2);
              if (0 < (int)uVar35) {
                uVar19 = 0;
                do {
                  uVar2 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
                  *(float *)((long)(qpTestLog **)local_1b0 + uVar19 * 4) =
                       pVVar3[(int)((long)uVar2 / (long)(int)uVar5)].val.floatV
                       [(long)uVar2 % (long)(int)uVar5 & 0xffffffff];
                  uVar19 = uVar19 + 1;
                } while ((uVar35 & 0x7fffffff) != uVar19);
              }
              GVar21 = (GLsizei)lVar34;
              switch(uVar5) {
              case 1:
                glu::CallLogWrapper::glProgramUniform1iv
                          (this_00,programGL,location,GVar21,(GLint *)local_1b0);
                dVar8 = glu::CallLogWrapper::glGetError(this_00);
                iVar6 = 0x5d7;
                pcVar15 = 
                "glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 2:
                glu::CallLogWrapper::glProgramUniform2iv
                          (this_00,programGL,location,GVar21,(GLint *)local_1b0);
                dVar8 = glu::CallLogWrapper::glGetError(this_00);
                iVar6 = 0x5d8;
                pcVar15 = 
                "glProgramUniform2iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 3:
                glu::CallLogWrapper::glProgramUniform3iv
                          (this_00,programGL,location,GVar21,(GLint *)local_1b0);
                dVar8 = glu::CallLogWrapper::glGetError(this_00);
                iVar6 = 0x5d9;
                pcVar15 = 
                "glProgramUniform3iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 4:
                glu::CallLogWrapper::glProgramUniform4iv
                          (this_00,programGL,location,GVar21,(GLint *)local_1b0);
                dVar8 = glu::CallLogWrapper::glGetError(this_00);
                iVar6 = 0x5da;
                pcVar15 = 
                "glProgramUniform4iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              default:
                goto switchD_0154c65c_default;
              }
              glu::checkError(dVar8,pcVar15,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,iVar6);
              goto switchD_0154c65c_default;
            }
            switch(uVar5) {
            case 1:
              glu::CallLogWrapper::glProgramUniform1i
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5c6;
              pcVar15 = "glProgramUniform1i(programGL, location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glProgramUniform2i
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5c7;
              pcVar15 = "glProgramUniform2i(programGL, location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glProgramUniform3i
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[2]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5c8;
              pcVar15 = "glProgramUniform3i(programGL, location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glProgramUniform4i
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[2],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[3]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5c9;
              pcVar15 = "glProgramUniform4i(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_0154c482_default;
            }
            glu::checkError(dVar8,pcVar15,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,iVar6);
          }
          else if (DVar7 - TYPE_UINT < 4) {
            if (cVar27 == '\0') {
              lVar34 = ((long)local_308.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_308.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b0,
                         (int)uVar5 * lVar34,(allocator_type *)&local_2c8);
              uVar35 = (uint)((ulong)(local_1a8._0_8_ - (long)local_1b0) >> 2);
              if (0 < (int)uVar35) {
                uVar19 = 0;
                do {
                  uVar2 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
                  *(float *)((long)(qpTestLog **)local_1b0 + uVar19 * 4) =
                       pVVar3[(int)((long)uVar2 / (long)(int)uVar5)].val.floatV
                       [(long)uVar2 % (long)(int)uVar5 & 0xffffffff];
                  uVar19 = uVar19 + 1;
                } while ((uVar35 & 0x7fffffff) != uVar19);
              }
              GVar21 = (GLsizei)lVar34;
              switch(uVar5) {
              case 1:
                glu::CallLogWrapper::glProgramUniform1uiv
                          (this_00,programGL,location,GVar21,(GLuint *)local_1b0);
                dVar8 = glu::CallLogWrapper::glGetError(this_00);
                iVar6 = 0x5f9;
                pcVar15 = 
                "glProgramUniform1uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 2:
                glu::CallLogWrapper::glProgramUniform2uiv
                          (this_00,programGL,location,GVar21,(GLuint *)local_1b0);
                dVar8 = glu::CallLogWrapper::glGetError(this_00);
                iVar6 = 0x5fa;
                pcVar15 = 
                "glProgramUniform2uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 3:
                glu::CallLogWrapper::glProgramUniform3uiv
                          (this_00,programGL,location,GVar21,(GLuint *)local_1b0);
                dVar8 = glu::CallLogWrapper::glGetError(this_00);
                iVar6 = 0x5fb;
                pcVar15 = 
                "glProgramUniform3uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 4:
                glu::CallLogWrapper::glProgramUniform4uiv
                          (this_00,programGL,location,GVar21,(GLuint *)local_1b0);
                dVar8 = glu::CallLogWrapper::glGetError(this_00);
                iVar6 = 0x5fc;
                pcVar15 = 
                "glProgramUniform4uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              default:
                goto switchD_0154c65c_default;
              }
              glu::checkError(dVar8,pcVar15,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,iVar6);
              goto switchD_0154c65c_default;
            }
            switch(uVar5) {
            case 1:
              glu::CallLogWrapper::glProgramUniform1ui
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5e8;
              pcVar15 = "glProgramUniform1ui(programGL, location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glProgramUniform2ui
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[1]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5e9;
              pcVar15 = "glProgramUniform2ui(programGL, location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glProgramUniform3ui
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[1],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[2]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5ea;
              pcVar15 = "glProgramUniform3ui(programGL, location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glProgramUniform4ui
                        (this_00,programGL,location,
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[1],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[2],
                         ((local_308.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[3]);
              dVar8 = glu::CallLogWrapper::glGetError(this_00);
              iVar6 = 0x5eb;
              pcVar15 = "glProgramUniform4ui(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_0154c482_default;
            }
            glu::checkError(dVar8,pcVar15,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,iVar6);
          }
          else if (DVar7 - TYPE_SAMPLER_1D < 0x1e) {
            if (cVar27 == '\0') {
              local_1b0._0_4_ = (pBVar1->finalValue).val.intV[0];
              glu::CallLogWrapper::glProgramUniform1iv
                        (this_00,programGL,location,
                         (int)((ulong)((long)local_308.
                                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_308.
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                         -0xf0f0f0f,(GLint *)local_1b0);
              GVar11 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar11,
                              "glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &unit)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x609);
            }
            else {
              glu::CallLogWrapper::glProgramUniform1i
                        (this_00,programGL,location,(pBVar1->finalValue).val.intV[0]);
              GVar11 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar11,
                              "glProgramUniform1i(programGL, location, uniform.finalValue.val.samplerV.unit)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x605);
            }
          }
        }
switchD_0154c482_default:
        operator_delete(pVVar3,(long)local_308.
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pVVar3);
      }
      else {
        std::__cxx11::string::rfind((char)pBVar1,0x5b);
        std::__cxx11::string::substr((ulong)local_230,(ulong)pBVar1);
LAB_0154ba43:
        uVar5 = *(uint *)&(local_330->super_CallLogWrapper).field_0x14;
        if ((uVar5 & 8) == 0) {
          uVar35 = 1;
          if ((uVar5 & 0x10) != 0) {
            uVar35 = ~pBVar1->elemNdx * 2 & 2;
            goto LAB_0154ba9a;
          }
          goto LAB_0154bb32;
        }
        if (pBVar1->elemNdx == 0) {
          uVar35 = pBVar1->rootSize;
LAB_0154ba9a:
          if (uVar35 != 0) goto LAB_0154bb32;
        }
        local_1b0 = (undefined1  [8])local_2e8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"// Uniform ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pBVar1->name)._M_dataplus._M_p,
                   (pBVar1->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   " is covered by another glProgramUniform*v() call to the same array",0x42);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (local_230[0] != local_220) {
        operator_delete(local_230[0],local_220[0] + 1);
      }
      local_208 = local_208 + 1;
      pBVar12 = (basicUniforms->
                super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (local_208 <
             (int)((ulong)((long)(basicUniforms->
                                 super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12) >> 3)
             * 0x286bca1b);
  }
  return;
}

Assistant:

void UniformCase::assignUniforms (const vector<BasicUniform>& basicUniforms, deUint32 programGL, Random& rnd)
{
	TestLog&				log				= m_testCtx.getLog();
	const bool				transpose		= (m_features & FEATURE_MATRIXMODE_ROWMAJOR) != 0;
	const GLboolean			transposeGL		= transpose ? GL_TRUE : GL_FALSE;
	const glu::DataType		boolApiType		= m_features & FEATURE_BOOLEANAPITYPE_INT	? glu::TYPE_INT
											: m_features & FEATURE_BOOLEANAPITYPE_UINT	? glu::TYPE_UINT
											:											  glu::TYPE_FLOAT;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform				= basicUniforms[unifNdx];
		const bool				isArrayMember		= uniform.elemNdx >= 0;
		const string			queryName			= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				numValuesToAssign	= !isArrayMember									? 1
													: m_features & FEATURE_ARRAYASSIGN_FULL				? (uniform.elemNdx == 0			? uniform.rootSize	: 0)
													: m_features & FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	? (uniform.elemNdx % 2 == 0		? 2					: 0)
													: /* Default: assign array elements separately */	  1;

		DE_ASSERT(numValuesToAssign >= 0);
		DE_ASSERT(numValuesToAssign == 1 || isArrayMember);

		if (numValuesToAssign == 0)
		{
			log << TestLog::Message << "// Uniform " << uniform.name << " is covered by another glProgramUniform*v() call to the same array" << TestLog::EndMessage;
			continue;
		}

		const int			location			= glGetUniformLocation(programGL, queryName.c_str());
		const int			typeSize			= glu::getDataTypeScalarSize(uniform.type);
		const bool			assignByValue		= m_features & FEATURE_UNIFORMFUNC_VALUE && !glu::isDataTypeMatrix(uniform.type) && numValuesToAssign == 1;
		vector<VarValue>	valuesToAssign;

		for (int i = 0; i < numValuesToAssign; i++)
		{
			const string	curName = isArrayMember ? beforeLast(uniform.rootName, '[') + "[" + de::toString(uniform.elemNdx+i) + "]" : uniform.name;
			VarValue		unifValue;

			if (isArrayMember)
			{
				const vector<BasicUniform>::const_iterator elemUnif = BasicUniform::findWithName(basicUniforms, curName.c_str());
				if (elemUnif == basicUniforms.end())
					continue;
				unifValue = elemUnif->finalValue;
			}
			else
				unifValue = uniform.finalValue;

			const VarValue apiValue = glu::isDataTypeBoolOrBVec(unifValue.type)	? getRandomBoolRepresentation(unifValue, boolApiType, rnd)
									: glu::isDataTypeSampler(unifValue.type)	? getSamplerUnitValue(unifValue)
									: unifValue;

			valuesToAssign.push_back(glu::isDataTypeMatrix(apiValue.type) && transpose ? getTransposeMatrix(apiValue) : apiValue);

			if (glu::isDataTypeBoolOrBVec(uniform.type))
				log << TestLog::Message << "// Using type " << glu::getDataTypeName(boolApiType) << " to set boolean value " << apiVarValueStr(unifValue) << " for " << curName << TestLog::EndMessage;
			else if (glu::isDataTypeSampler(uniform.type))
				log << TestLog::Message << "// Texture for the sampler uniform " << curName << " will be filled with color " << apiVarValueStr(getSamplerFillValue(uniform.finalValue)) << TestLog::EndMessage;
		}

		DE_ASSERT(!valuesToAssign.empty());

		if (glu::isDataTypeFloatOrVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const float* const ptr = &valuesToAssign[0].val.floatV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1f(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2f(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3f(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4f(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<float> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeMatrix(valuesToAssign[0].type))
		{
			DE_ASSERT(!assignByValue);

			vector<float> buffer(valuesToAssign.size() * typeSize);
			for (int i = 0; i < (int)buffer.size(); i++)
				buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

			DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
			switch (uniform.type)
			{
				case glu::TYPE_FLOAT_MAT2:		GLU_CHECK_CALL(glProgramUniformMatrix2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3:		GLU_CHECK_CALL(glProgramUniformMatrix3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4:		GLU_CHECK_CALL(glProgramUniformMatrix4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT2X3:	GLU_CHECK_CALL(glProgramUniformMatrix2x3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT2X4:	GLU_CHECK_CALL(glProgramUniformMatrix2x4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3X2:	GLU_CHECK_CALL(glProgramUniformMatrix3x2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3X4:	GLU_CHECK_CALL(glProgramUniformMatrix3x4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4X2:	GLU_CHECK_CALL(glProgramUniformMatrix4x2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4X3:	GLU_CHECK_CALL(glProgramUniformMatrix4x3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				default:
					DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deInt32* const ptr = &valuesToAssign[0].val.intV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1i(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2i(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3i(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4i(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deInt32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeUintOrUVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deUint32* const ptr = &valuesToAssign[0].val.uintV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1ui(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2ui(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3ui(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4ui(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deUint32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLuint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeSampler(valuesToAssign[0].type))
		{
			if (assignByValue)
				GLU_CHECK_CALL(glProgramUniform1i(programGL, location, uniform.finalValue.val.samplerV.unit));
			else
			{
				const GLint unit = uniform.finalValue.val.samplerV.unit;
				GLU_CHECK_CALL(glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &unit));
			}
		}
		else
			DE_ASSERT(false);
	}
}